

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O0

void __thiscall
OpenMD::SelectionEvaluator::withinInstruction
          (SelectionEvaluator *this,Token *instruction,SelectionSet *bs)

{
  bool bVar1;
  any *in_RDI;
  float distance;
  any withinSpec;
  RealType in_stack_00000438;
  SelectionSet *in_stack_00000440;
  DistanceFinder *in_stack_00000448;
  string *in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  any *in_stack_ffffffffffffff80;
  allocator<char> local_61;
  allocator<char> *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  
  std::any::any(in_stack_ffffffffffffff80,in_RDI);
  std::any::type(in_RDI);
  bVar1 = std::type_info::operator==((type_info *)in_stack_ffffffffffffff80,(type_info *)in_RDI);
  if (bVar1) {
    in_stack_ffffffffffffff74 =
         std::any_cast<float>((any *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  }
  else {
    std::any::type(in_RDI);
    bVar1 = std::type_info::operator==((type_info *)in_stack_ffffffffffffff80,(type_info *)in_RDI);
    if (bVar1) {
      in_stack_ffffffffffffff70 =
           std::any_cast<int>((any *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    }
    else {
      in_stack_ffffffffffffff68 = (string *)&local_61;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      evalError((SelectionEvaluator *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                in_stack_ffffffffffffff68);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
      std::allocator<char>::~allocator(&local_61);
      SelectionSet::clearAll
                ((SelectionSet *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    }
  }
  DistanceFinder::find(in_stack_00000448,in_stack_00000440,in_stack_00000438);
  SelectionSet::operator=
            ((SelectionSet *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             (SelectionSet *)in_stack_ffffffffffffff68);
  SelectionSet::~SelectionSet((SelectionSet *)0x3c2299);
  std::any::~any((any *)0x3c22a3);
  return;
}

Assistant:

void SelectionEvaluator::withinInstruction(const Token& instruction,
                                             SelectionSet& bs) {
    std::any withinSpec = instruction.value;
    float distance(0.0);
    if (withinSpec.type() == typeid(float)) {
      distance = std::any_cast<float>(withinSpec);
    } else if (withinSpec.type() == typeid(int)) {
      distance = std::any_cast<int>(withinSpec);
    } else {
      evalError("casting error in withinInstruction");
      bs.clearAll();
    }

    bs = distanceFinder.find(bs, distance);
  }